

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UnaryFunctionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_unary(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  UnaryFunctionLayerParams *pUVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_unary(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_unary(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pUVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::UnaryFunctionLayerParams>(arena);
    (this->layer_).unary_ = pUVar2;
  }
  return (UnaryFunctionLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UnaryFunctionLayerParams* NeuralNetworkLayer::_internal_mutable_unary() {
  if (!_internal_has_unary()) {
    clear_layer();
    set_has_unary();
    layer_.unary_ = CreateMaybeMessage< ::CoreML::Specification::UnaryFunctionLayerParams >(GetArenaForAllocation());
  }
  return layer_.unary_;
}